

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_write_attributes_float(void *a,float *attrib,uint32_t nr_of_attribs)

{
  uint8_t *__src;
  int iVar1;
  int iVar2;
  uint64_t sz;
  ulong bytes_needed;
  uint32_t nr_of_compressed_bytes;
  uint8_t *compressed;
  uint local_2c;
  uint8_t *local_28;
  
  iVar1 = buffer_ready_for_writing((trico_archive *)a,1);
  iVar2 = 0;
  if (iVar1 != 0) {
    **(undefined1 **)((long)a + 8) = 0xf;
    *(long *)((long)a + 8) = *(long *)((long)a + 8) + 1;
    *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -1;
    iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
    iVar2 = 0;
    if (iVar1 != 0) {
      **(uint32_t **)((long)a + 8) = nr_of_attribs;
      *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
      *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
      trico_compress(&local_2c,&local_28,attrib,nr_of_attribs,4,10);
      iVar1 = buffer_ready_for_writing((trico_archive *)a,4);
      __src = local_28;
      iVar2 = 0;
      if (iVar1 != 0) {
        **(uint **)((long)a + 8) = local_2c;
        *(long *)((long)a + 8) = *(long *)((long)a + 8) + 4;
        *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) + -4;
        bytes_needed = (ulong)local_2c;
        iVar1 = buffer_ready_for_writing((trico_archive *)a,bytes_needed);
        if (iVar1 != 0) {
          memcpy(*(void **)((long)a + 8),__src,bytes_needed);
          *(long *)((long)a + 8) = *(long *)((long)a + 8) + bytes_needed;
          *(long *)((long)a + 0x38) = *(long *)((long)a + 0x38) - bytes_needed;
          free(local_28);
          iVar2 = 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int trico_write_attributes_float(void* a, const float* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_float_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;  

  uint32_t nr_of_compressed_bytes;
  uint8_t* compressed;
  trico_compress(&nr_of_compressed_bytes, &compressed, attrib, nr_of_attribs, 4, 10);

  if (!write(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  trico_free(compressed);  

  return 1;
  }